

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadCount(BinaryReader *this,Index *count,char *desc)

{
  Result RVar1;
  
  RVar1 = ReadIndex(this,count,desc);
  if (RVar1.enum_ != Error) {
    if ((ulong)*count <= this->read_end_ - (this->state_).offset) {
      return (Result)Ok;
    }
    PrintError(this,"invalid %s %u, only %zd bytes left in section",desc);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadCount(Index* count, const char* desc) {
  CHECK_RESULT(ReadIndex(count, desc));

  // This check assumes that each item follows in this section, and takes at
  // least 1 byte. It's possible that this check passes but reading fails
  // later. It is still useful to check here, though, because it early-outs
  // when an erroneous large count is used, before allocating memory for it.
  size_t section_remaining = read_end_ - state_.offset;
  if (*count > section_remaining) {
    PrintError("invalid %s %" PRIindex ", only %" PRIzd
               " bytes left in section",
               desc, *count, section_remaining);
    return Result::Error;
  }
  return Result::Ok;
}